

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirSAVEHOB(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *fhobname;
  string local_98;
  allocator<char> local_61;
  string local_60 [8];
  string fnaamh;
  path fnaam;
  bool exec;
  int length;
  int start;
  aint val;
  
  if ((DeviceID == (char *)0x0) || (pass != 3)) {
    if (DeviceID == (char *)0x0) {
      Error("SAVEHOB only allowed in real device emulation mode (See DEVICE)",(char *)0x0,PASS3);
    }
    SkipToEol(&lp);
    return;
  }
  fnaam._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._4_4_ =
       -1;
  GetOutputFileName_abi_cxx11_((path *)((long)&fnaamh.field_2 + 8),&lp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"",&local_61);
  std::allocator<char>::~allocator(&local_61);
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = anyComma(&lp);
    if (bVar1) {
      Error("[SAVEHOB] Syntax error. No parameters",bp,PASS3);
    }
    else {
      GetDelimitedString_abi_cxx11_(&local_98,&lp);
      std::__cxx11::string::operator=(local_60,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        bVar1 = anyComma(&lp);
        if (bVar1) {
          bVar1 = anyComma(&lp);
          if (bVar1) {
            Error("[SAVEHOB] Syntax error. No parameters",bp,PASS3);
          }
          else {
            iVar2 = ParseExpression(&lp,&length);
            iVar3 = length;
            if (iVar2 == 0) {
              Error("[SAVEHOB] Syntax error",bp,PASS3);
            }
            else if (length < 0x4000) {
              Error("[SAVEHOB] Values less than 4000h are not allowed",bp,PASS3);
            }
            else if (length < 0x10000) {
              bVar1 = anyComma(&lp);
              if (bVar1) {
                iVar2 = ParseExpression(&lp,&length);
                if (iVar2 == 0) {
                  Error("[SAVEHOB] Syntax error",bp,PASS3);
                  goto LAB_001114d0;
                }
                if (length < 0) {
                  Error("[SAVEHOB] Negative values are not allowed",bp,PASS3);
                  goto LAB_001114d0;
                }
                fnaam._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl._4_4_ = length;
              }
              fhobname = (char *)std::__cxx11::string::c_str();
              iVar3 = SaveHobeta((path *)((long)&fnaamh.field_2 + 8),fhobname,iVar3,
                                 fnaam._M_cmpts._M_impl._M_t.
                                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 .
                                 super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                 ._M_head_impl._4_4_);
              if (iVar3 == 0) {
                Error("[SAVEHOB] Error writing file (Disk full?)",bp,IF_FIRST);
              }
            }
            else {
              Error("[SAVEHOB] Values more than FFFFh are not allowed",bp,PASS3);
            }
          }
        }
        else {
          Error("[SAVEHOB] Syntax error. No parameters",bp,PASS3);
        }
      }
      else {
        Error("[SAVEHOB] Syntax error",bp,PASS3);
      }
    }
  }
  else {
    Error("[SAVEHOB] Syntax error. No parameters",bp,PASS3);
  }
LAB_001114d0:
  std::__cxx11::string::~string(local_60);
  std::filesystem::__cxx11::path::~path((path *)((long)&fnaamh.field_2 + 8));
  return;
}

Assistant:

static void dirSAVEHOB() {
	if (!DeviceID || pass != LASTPASS) {
		if (!DeviceID) Error("SAVEHOB only allowed in real device emulation mode (See DEVICE)");
		SkipToEol(lp);
		return;
	}
	aint val;
	int start = -1,length = -1;
	bool exec = true;

	const std::filesystem::path fnaam = GetOutputFileName(lp);
	std::string fnaamh {""};
	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			fnaamh = GetDelimitedString(lp);
			if (fnaamh.empty()) {
				Error("[SAVEHOB] Syntax error", bp, PASS3); return;
			}
		} else {
		  	Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return;
		}
	} else {
		Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return; //is this ok?
	}

	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			if (!ParseExpression(lp, val)) {
				Error("[SAVEHOB] Syntax error", bp, PASS3); return;
			}
			if (val < 0x4000) {
				Error("[SAVEHOB] Values less than 4000h are not allowed", bp, PASS3); return;
			} else if (val > 0xFFFF) {
			  	Error("[SAVEHOB] Values more than FFFFh are not allowed", bp, PASS3); return;
			}
			start = val;
		} else {
		  	Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return;
		}
		if (anyComma(lp)) {
			if (!ParseExpression(lp, val)) {
				Error("[SAVEHOB] Syntax error", bp, PASS3); return;
			}
			if (val < 0) {
				Error("[SAVEHOB] Negative values are not allowed", bp, PASS3); return;
			}
			length = val;
		}
	} else {
		Error("[SAVEHOB] Syntax error. No parameters", bp, PASS3); return;
	}
	if (exec && !SaveHobeta(fnaam, fnaamh.c_str(), start, length)) {
		Error("[SAVEHOB] Error writing file (Disk full?)", bp, IF_FIRST); return;
	}
}